

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite>::
AdapterPromiseNode<kj::(anonymous_namespace)::AsyncPipe&,kj::ArrayPtr<unsigned_char_const>const&,kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>>
          (AdapterPromiseNode<kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite> *this,
          AsyncPipe *params,ArrayPtr<const_unsigned_char> *params_1,
          ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *params_2)

{
  ArrayPtr<const_unsigned_char> writeBuffer;
  AsyncPipe *pipe;
  ArrayPtr<const_unsigned_char> *pAVar1;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *pAVar2;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *params_local_2;
  ArrayPtr<const_unsigned_char> *params_local_1;
  AsyncPipe *params_local;
  AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite> *this_local;
  
  AdapterPromiseNodeBase::AdapterPromiseNodeBase((AdapterPromiseNodeBase *)this);
  PromiseFulfiller<void>::PromiseFulfiller((PromiseFulfiller<void> *)(this + 0x10));
  *(undefined ***)this = &PTR_onReady_007daa10;
  *(undefined ***)(this + 0x10) = &PTR_fulfill_007daa58;
  ExceptionOr<kj::_::Void>::ExceptionOr((ExceptionOr<kj::_::Void> *)(this + 0x18));
  this[0x180] = (AdapterPromiseNode<kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite>)
                0x1;
  pipe = fwd<kj::(anonymous_namespace)::AsyncPipe&>(params);
  pAVar1 = fwd<kj::ArrayPtr<unsigned_char_const>const&>(params_1);
  writeBuffer = *pAVar1;
  pAVar2 = fwd<kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>>(params_2);
  anon_unknown_77::AsyncPipe::BlockedWrite::BlockedWrite
            ((BlockedWrite *)(this + 0x188),(PromiseFulfiller<void> *)(this + 0x10),pipe,writeBuffer
             ,*pAVar2);
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}